

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void __thiscall
iqxmlrpc::http::Response_header::Response_header
          (Response_header *this,Verification_level lev,string *to_parse)

{
  int iVar1;
  string *Input;
  size_type sVar2;
  Malformed_packet *this_00;
  reference pvVar3;
  bad_lexical_cast *anon_var_0;
  string local_108;
  locale local_e8;
  is_classifiedF local_e0;
  undefined1 local_d0 [8];
  Token resp_line;
  string local_78;
  allocator<char> local_51;
  string local_50;
  string *local_20;
  string *to_parse_local;
  Response_header *pRStack_10;
  Verification_level lev_local;
  Response_header *this_local;
  
  local_20 = to_parse;
  to_parse_local._4_4_ = lev;
  pRStack_10 = this;
  Header::Header(&this->super_Header,lev);
  (this->super_Header)._vptr_Header = (_func_int **)&PTR__Response_header_002528d0;
  std::__cxx11::string::string((string *)&this->phrase_);
  Header::parse(&this->super_Header,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"server",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"unknown",
             (allocator<char> *)
             ((long)&resp_line.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node + 7));
  Header::set_option_default(&this->super_Header,&local_50,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&resp_line.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node + 7));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_d0);
  Input = Header::get_head_line_abi_cxx11_(&this->super_Header);
  std::locale::locale(&local_e8);
  boost::algorithm::is_space((algorithm *)&local_e0,&local_e8);
  boost::algorithm::
  split<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_classifiedF>
            ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d0,Input,&local_e0,token_compress_on);
  boost::algorithm::detail::is_classifiedF::~is_classifiedF(&local_e0);
  std::locale::~locale(&local_e8);
  sVar2 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  if (sVar2 < 2) {
    anon_var_0._6_1_ = 1;
    this_00 = (Malformed_packet *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"Bad response",(allocator<char> *)((long)&anon_var_0 + 7));
    Malformed_packet::Malformed_packet(this_00,&local_108);
    anon_var_0._6_1_ = 0;
    __cxa_throw(this_00,&Malformed_packet::typeinfo,Malformed_packet::~Malformed_packet);
  }
  pvVar3 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_d0,1);
  iVar1 = boost::lexical_cast<int,std::__cxx11::string>(pvVar3);
  *(int *)&(this->super_Header).field_0x8c = iVar1;
  sVar2 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  if (2 < sVar2) {
    pvVar3 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_d0,2);
    std::__cxx11::string::operator=((string *)&this->phrase_,(string *)pvVar3);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0);
  return;
}

Assistant:

Response_header::Response_header(Verification_level lev, const std::string& to_parse):
  Header(lev)
{
  parse(to_parse);
  set_option_default(names::server, "unknown");

  typedef std::deque<std::string> Token;
  Token resp_line;
  boost::split(resp_line, get_head_line(), boost::is_space(), boost::token_compress_on);

  if (resp_line.size() < 2) {
    throw Malformed_packet("Bad response");
  }

  try {
    code_ = boost::lexical_cast<int>(resp_line[1]);
  } catch (const boost::bad_lexical_cast&) {
    code_ = 0;
  }

  if (resp_line.size() > 2)
    phrase_ = resp_line[2];
}